

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_initCStream_internal
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_CDict *cdict,
                 ZSTD_CCtx_params *params,unsigned_long_long pledgedSrcSize)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ZSTD_compressionParameters cParams;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  size_t sVar8;
  ulong uVar9;
  undefined4 local_3c;
  undefined4 uStack_38;
  
  zcs->streamStage = zcss_init;
  zcs->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  uVar1 = (params->cParams).searchLog;
  uVar5 = (params->cParams).windowLog;
  uVar6 = (params->cParams).chainLog;
  uVar7 = (params->cParams).hashLog;
  cParams.hashLog = uVar7;
  cParams.chainLog = uVar6;
  cParams.windowLog = uVar5;
  uVar2 = (params->cParams).minMatch;
  uVar3 = (params->cParams).targetLength;
  uVar4 = (params->cParams).strategy;
  cParams.strategy = uVar4;
  cParams.targetLength = uVar3;
  cParams.searchLog = uVar1;
  cParams.minMatch = uVar2;
  sVar8 = ZSTD_checkCParams(cParams);
  if (0xffffffffffffff88 < sVar8) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params->cParams))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x6733,
                  "size_t ZSTD_initCStream_internal(ZSTD_CStream *, const void *, size_t, const ZSTD_CDict *, const ZSTD_CCtx_params *, unsigned long long)"
                 );
  }
  memcpy(&zcs->requestedParams,params,0xd0);
  if (cdict == (ZSTD_CDict *)0x0 || dict == (void *)0x0) {
    if (dict == (void *)0x0) {
      uVar9 = ZSTD_CCtx_refCDict(zcs,cdict);
    }
    else {
      uVar9 = ZSTD_CCtx_loadDictionary(zcs,dict,dictSize);
    }
    if (uVar9 < 0xffffffffffffff89) {
      uVar9 = 0;
    }
    return uVar9;
  }
  __assert_fail("!((dict) && (cdict))",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x6735,
                "size_t ZSTD_initCStream_internal(ZSTD_CStream *, const void *, size_t, const ZSTD_CDict *, const ZSTD_CCtx_params *, unsigned long long)"
               );
}

Assistant:

size_t ZSTD_initCStream_internal(ZSTD_CStream* zcs,
                    const void* dict, size_t dictSize, const ZSTD_CDict* cdict,
                    const ZSTD_CCtx_params* params,
                    unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_internal");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setPledgedSrcSize(zcs, pledgedSrcSize) , "");
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));
    zcs->requestedParams = *params;
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */
    if (dict) {
        FORWARD_IF_ERROR( ZSTD_CCtx_loadDictionary(zcs, dict, dictSize) , "");
    } else {
        /* Dictionary is cleared if !cdict */
        FORWARD_IF_ERROR( ZSTD_CCtx_refCDict(zcs, cdict) , "");
    }
    return 0;
}